

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_ssim.cpp
# Opt level: O1

void basisu::scale_image(imagef *src,imagef *dst,vec4F *scale,vec4F *shift)

{
  vec<4U,_float> *pvVar1;
  vec<4U,_float> *pvVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  vec4F local_38;
  
  local_38.m_v[0] = 0.0;
  local_38.m_v[1] = 0.0;
  local_38.m_v[2] = 0.0;
  local_38.m_v[3] = 1.0;
  imagef::crop(dst,src->m_width,src->m_height,0xffffffff,&local_38);
  if (0 < (int)dst->m_height) {
    uVar12 = 0;
    do {
      if (dst->m_width != 0) {
        uVar13 = 0;
        do {
          if ((src->m_width <= uVar13) || (src->m_height <= uVar12)) {
            __assert_fail("x < m_width && y < m_height",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                          ,0xc3d,"const vec4F &basisu::imagef::operator()(uint32_t, uint32_t) const"
                         );
          }
          uVar14 = src->m_pitch * uVar12 + uVar13;
          if ((src->m_pixels).m_size <= uVar14) {
            __assert_fail("i < m_size",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                          ,0x177,
                          "const T &basisu::vector<basisu::vec<4, float>>::operator[](size_t) const [T = basisu::vec<4, float>]"
                         );
          }
          if (dst->m_height <= uVar12) {
            __assert_fail("x < m_width && y < m_height",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                          ,0xc3e,"vec4F &basisu::imagef::operator()(uint32_t, uint32_t)");
          }
          uVar15 = dst->m_pitch * uVar12 + uVar13;
          if ((dst->m_pixels).m_size <= uVar15) {
            __assert_fail("i < m_size",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                          ,0x178,
                          "T &basisu::vector<basisu::vec<4, float>>::operator[](size_t) [T = basisu::vec<4, float>]"
                         );
          }
          fVar3 = scale->m_v[1];
          fVar4 = scale->m_v[2];
          fVar5 = scale->m_v[3];
          pvVar1 = (src->m_pixels).m_p + uVar14;
          fVar6 = pvVar1->m_v[1];
          fVar7 = pvVar1->m_v[2];
          fVar8 = pvVar1->m_v[3];
          fVar9 = shift->m_v[1];
          fVar10 = shift->m_v[2];
          fVar11 = shift->m_v[3];
          pvVar2 = (dst->m_pixels).m_p + uVar15;
          pvVar2->m_v[0] = shift->m_v[0] + pvVar1->m_v[0] * scale->m_v[0];
          pvVar2->m_v[1] = fVar9 + fVar6 * fVar3;
          pvVar2->m_v[2] = fVar10 + fVar7 * fVar4;
          pvVar2->m_v[3] = fVar11 + fVar8 * fVar5;
          uVar13 = uVar13 + 1;
        } while (uVar13 < dst->m_width);
      }
      uVar12 = uVar12 + 1;
    } while ((int)uVar12 < (int)dst->m_height);
  }
  return;
}

Assistant:

void scale_image(const imagef &src, imagef &dst, const vec4F &scale, const vec4F &shift)
	{
		dst.resize(src);

//#pragma omp parallel for
		for (int y = 0; y < (int)dst.get_height(); y++)
		{
			for (uint32_t x = 0; x < dst.get_width(); x++)
			{
				const vec4F &p = src(x, y);

				vec4F d;

				for (uint32_t c = 0; c < 4; c++)
					d[c] = scale[c] * p[c] + shift[c];

				dst(x, y).set(d[0], d[1], d[2], d[3]);
			}
		}
	}